

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

int __thiscall
Lib::Stack<SAT::SATLiteral>::truncate(Stack<SAT::SATLiteral> *this,char *__file,__off_t __length)

{
  SATLiteral *p;
  size_t len_local;
  Stack<SAT::SATLiteral> *this_local;
  
  for (p = this->_stack + (long)__file; p != this->_cursor; p = p + 1) {
  }
  this->_cursor = this->_stack + (long)__file;
  return (int)this;
}

Assistant:

inline
  void truncate(size_t len)
  {
    ASS_LE(len,length());
    C* p=_stack+len;
    while(p!=_cursor) {
      (p++)->~C();
    }
    _cursor = _stack+len;
  }